

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage4.cpp
# Opt level: O2

void test(bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  Framer framer;
  string local_130;
  pstring astring;
  test_resource tpmr;
  
  Framer::Framer(&framer,"Stage4",verbose);
  std::pmr::test_resource::test_resource(&tpmr,"stage4",verbose);
  tpmr.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  pstring::pstring(&astring,"barfool",(allocator_type)&tpmr);
  pstring::str_abi_cxx11_(&local_130,&astring);
  bVar1 = std::operator!=(&local_130,"barfool");
  std::__cxx11::string::~string((string *)&local_130);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"astring.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_130,&astring);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_130);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_130);
  }
  pstring::~pstring(&astring);
  std::pmr::test_resource::~test_resource(&tpmr);
  Framer::~Framer(&framer);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Stage4", verbose };

    std::pmr::test_resource tpmr{ "stage4", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };

    ASSERT_EQ(astring.str(), "barfool");
}